

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PrefixParameter(char *zParam,int *pnIndex,Fts3Index **apIndex)

{
  int iVar1;
  int local_50;
  int local_4c;
  int nPrefix;
  int i;
  char *p_1;
  char *p;
  void *pvStack_30;
  int nIndex;
  Fts3Index *aIndex;
  Fts3Index **apIndex_local;
  int *pnIndex_local;
  char *zParam_local;
  
  p._4_4_ = 1;
  if ((zParam != (char *)0x0) && (*zParam != '\0')) {
    p._4_4_ = 2;
    for (p_1 = zParam; *p_1 != '\0'; p_1 = p_1 + 1) {
      if (*p_1 == ',') {
        p._4_4_ = p._4_4_ + 1;
      }
    }
  }
  aIndex = (Fts3Index *)apIndex;
  apIndex_local = (Fts3Index **)pnIndex;
  pnIndex_local = (int *)zParam;
  pvStack_30 = sqlite3_malloc64((long)p._4_4_ * 0x28);
  *(void **)aIndex = pvStack_30;
  if (pvStack_30 == (void *)0x0) {
    zParam_local._4_4_ = 7;
  }
  else {
    memset(pvStack_30,0,(long)p._4_4_ * 0x28);
    if (pnIndex_local != (int *)0x0) {
      _nPrefix = pnIndex_local;
      for (local_4c = 1; local_4c < p._4_4_; local_4c = local_4c + 1) {
        local_50 = 0;
        iVar1 = fts3GobbleInt((char **)&nPrefix,&local_50);
        if (iVar1 != 0) {
          return 1;
        }
        if (local_50 == 0) {
          p._4_4_ = p._4_4_ + -1;
          local_4c = local_4c + -1;
        }
        else {
          *(int *)((long)pvStack_30 + (long)local_4c * 0x28) = local_50;
        }
        _nPrefix = (int *)((long)_nPrefix + 1);
      }
    }
    *(int *)apIndex_local = p._4_4_;
    zParam_local._4_4_ = 0;
  }
  return zParam_local._4_4_;
}

Assistant:

static int fts3PrefixParameter(
  const char *zParam,             /* ABC in prefix=ABC parameter to parse */
  int *pnIndex,                   /* OUT: size of *apIndex[] array */
  struct Fts3Index **apIndex      /* OUT: Array of indexes for this table */
){
  struct Fts3Index *aIndex;       /* Allocated array */
  int nIndex = 1;                 /* Number of entries in array */

  if( zParam && zParam[0] ){
    const char *p;
    nIndex++;
    for(p=zParam; *p; p++){
      if( *p==',' ) nIndex++;
    }
  }

  aIndex = sqlite3_malloc64(sizeof(struct Fts3Index) * nIndex);
  *apIndex = aIndex;
  if( !aIndex ){
    return SQLITE_NOMEM;
  }

  memset(aIndex, 0, sizeof(struct Fts3Index) * nIndex);
  if( zParam ){
    const char *p = zParam;
    int i;
    for(i=1; i<nIndex; i++){
      int nPrefix = 0;
      if( fts3GobbleInt(&p, &nPrefix) ) return SQLITE_ERROR;
      assert( nPrefix>=0 );
      if( nPrefix==0 ){
        nIndex--;
        i--;
      }else{
        aIndex[i].nPrefix = nPrefix;
      }
      p++;
    }
  }

  *pnIndex = nIndex;
  return SQLITE_OK;
}